

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCOpenings.cpp
# Opt level: O1

bool Assimp::IFC::TryAddOpenings_Poly2Tri
               (vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                *openings,vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *nors,
               TempMesh *curmesh)

{
  pointer *ppaVar1;
  pointer *ppuVar2;
  Point *pPVar3;
  Point *pPVar4;
  _func_int *p_Var5;
  _func_int *p_Var6;
  pointer paVar7;
  element_type *peVar8;
  pointer pIVar9;
  IfcSolidModel *pIVar10;
  iterator __position;
  _func_int **pp_Var11;
  iterator __position_00;
  iterator __position_01;
  long64 lVar12;
  CDT *this;
  pointer pvVar13;
  pointer pvVar14;
  pointer paVar15;
  pointer ppOVar16;
  bool bVar17;
  vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *pvVar18;
  ulong uVar19;
  IntPoint *pIVar20;
  IntPoint *pIVar21;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *__range2;
  IfcVector3 *xx;
  pointer paVar22;
  pointer pTVar23;
  IfcVector2 *pip_1;
  long lVar24;
  pointer paVar25;
  pointer pIVar26;
  pointer pTVar27;
  IfcVector2 *pip;
  IntPoint *pIVar28;
  IfcVector3 *x;
  IfcSolidModel *pIVar29;
  IntPoint *point;
  undefined4 uVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  undefined4 uVar33;
  undefined4 uVar34;
  undefined4 uVar35;
  undefined4 uVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> contour;
  Polygon hole;
  bool ok;
  Polygon *__range3;
  IfcVector3 vv_extr;
  vector<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
  contours;
  IfcMatrix3 m;
  vector<p2t::Point_*,_std::allocator<p2t::Point_*>_> contour_points;
  vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> contour_flat;
  Polygons holes_union;
  ExPolygons clipped;
  IfcVector3 nor;
  Clipper clipper_holes;
  aiVector3t<double> local_3e8;
  pointer local_3c0;
  vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> local_3b8;
  CDT *local_398;
  double local_390;
  double local_388;
  double local_380;
  bool local_371;
  pointer local_370;
  vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> local_368;
  pointer local_340;
  pointer local_338;
  pointer local_330;
  pointer local_328;
  double local_320;
  pointer local_318;
  double local_310;
  double local_308;
  double local_300;
  vector<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
  local_2f8;
  pointer local_2d8;
  IfcMatrix3 local_2d0;
  vector<p2t::Point_*,_std::allocator<p2t::Point_*>_> local_288;
  vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> local_268;
  double local_248;
  double local_240;
  double local_238;
  double local_230;
  Polygons local_228;
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  ExPolygons local_1e8;
  pointer local_1d0;
  IfcVector3 local_1c8;
  Clipper local_1a8;
  
  LogFunctions<Assimp::IFCImporter>::LogWarn((char *)0x5dfbf1);
  local_1c8.x = 0.0;
  local_1c8.y = 0.0;
  local_1c8.z = 0.0;
  DerivePlaneCoordinateSpace(&local_2d0,curmesh,&local_371,&local_1c8);
  if (local_371 == true) {
    dVar38 = local_2d0.b1 * -local_2d0.a2;
    local_3c0 = (pointer)local_2d0.c2;
    dVar39 = -local_2d0.a3;
    local_308 = local_2d0.b2 * dVar39 * local_2d0.c1 +
                local_2d0.a3 * local_2d0.b1 * local_2d0.c2 +
                dVar38 * local_2d0.c3 +
                local_2d0.a2 * local_2d0.b3 * local_2d0.c1 +
                (local_2d0.a1 * local_2d0.b2 * local_2d0.c3 -
                local_2d0.b3 * local_2d0.a1 * local_2d0.c2);
    if ((local_308 != 0.0) || (NAN(local_308))) {
      local_308 = 1.0 / local_308;
      local_230 = -local_308;
      local_1f8._8_8_ = 0;
      local_1f8._0_8_ = (local_2d0.a2 * local_2d0.c3 + local_2d0.c2 * dVar39) * local_230;
      local_248 = (local_2d0.b1 * local_2d0.c3 - local_2d0.b3 * local_2d0.c1) * local_230;
      local_300 = (local_2d0.b3 * local_2d0.a1 + dVar39 * local_2d0.b1) * local_230;
      local_230 = (local_2d0.a1 * local_2d0.c2 + -local_2d0.a2 * local_2d0.c1) * local_230;
      local_310 = (local_2d0.b2 * local_2d0.c3 - local_2d0.c2 * local_2d0.b3) * local_308;
      local_208._8_8_ = 0;
      local_208._0_8_ = (local_2d0.a2 * local_2d0.b3 + local_2d0.b2 * dVar39) * local_308;
      local_240 = (local_2d0.c3 * local_2d0.a1 + local_2d0.c1 * dVar39) * local_308;
      local_238 = (local_2d0.b1 * local_2d0.c2 - local_2d0.b2 * local_2d0.c1) * local_308;
      local_308 = (local_2d0.a1 * local_2d0.b2 + dVar38) * local_308;
    }
    else {
      local_1f8 = ZEXT816(0x7ff8000000000000);
      local_208 = ZEXT816(0x7ff8000000000000);
      local_248 = NAN;
      local_240 = NAN;
      local_300 = NAN;
      local_238 = NAN;
      local_230 = NAN;
      local_310 = NAN;
      local_308 = NAN;
    }
    local_268.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl.
    super__Vector_impl_data._M_start = (aiVector2t<double> *)0x0;
    local_268.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (aiVector2t<double> *)0x0;
    local_268.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (aiVector2t<double> *)0x0;
    std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::reserve
              (&local_268,
               ((long)(curmesh->mVerts).
                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(curmesh->mVerts).
                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
    paVar22 = (curmesh->mVerts).
              super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
              super__Vector_impl_data._M_start;
    paVar7 = (curmesh->mVerts).
             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
    local_328 = (pointer)nors;
    if (paVar22 == paVar7) {
      local_398 = (CDT *)0xbff0000000000000;
      uVar30 = 0x20000000;
      uVar34 = 0x4202a05f;
      local_390 = -10000000000.0;
      uVar32 = 0x20000000;
      uVar36 = 0xc202a05f;
      local_388 = 10000000000.0;
    }
    else {
      local_388 = 10000000000.0;
      local_380 = 10000000000.0;
      local_3c0 = (pointer)0xc202a05f20000000;
      local_390 = -10000000000.0;
      do {
        local_2d8 = (pointer)paVar22->x;
        local_370 = (pointer)paVar22->y;
        local_320 = paVar22->z;
        local_330 = (pointer)(local_2d0.a3 * local_320 +
                             local_2d0.a1 * (double)local_2d8 + local_2d0.a2 * (double)local_370);
        local_318 = (pointer)(local_2d0.b3 * local_320 +
                             local_2d0.b1 * (double)local_2d8 + local_2d0.b2 * (double)local_370);
        local_338 = (pointer)local_2d0.c1;
        local_340 = (pointer)local_2d0.c2;
        local_398 = (CDT *)local_2d0.c3;
        local_1a8._vptr_Clipper = (_func_int **)local_330;
        local_1a8.m_PolyOuts.
        super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)local_318;
        if (local_268.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish ==
            local_268.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<aiVector2t<double>,std::allocator<aiVector2t<double>>>::
          _M_realloc_insert<aiVector2t<double>>
                    ((vector<aiVector2t<double>,std::allocator<aiVector2t<double>>> *)&local_268,
                     (iterator)
                     local_268.
                     super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(aiVector2t<double> *)&local_1a8);
        }
        else {
          (local_268.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
           _M_impl.super__Vector_impl_data._M_finish)->x = (double)local_330;
          (local_268.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
           _M_impl.super__Vector_impl_data._M_finish)->y = (double)local_318;
          local_268.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               local_268.
               super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        uVar31 = (undefined4)((ulong)local_330 >> 0x20);
        uVar32 = SUB84(local_388,0);
        uVar30 = (int)((ulong)local_388 >> 0x20);
        if ((double)local_330 <= local_388) {
          uVar32 = (int)local_330;
          uVar30 = uVar31;
        }
        local_388 = (double)CONCAT44(uVar30,uVar32);
        uVar33 = (undefined4)((ulong)local_318 >> 0x20);
        uVar30 = SUB84(local_380,0);
        uVar34 = (int)((ulong)local_380 >> 0x20);
        if ((double)local_318 <= local_380) {
          uVar30 = (int)local_318;
          uVar34 = uVar33;
        }
        local_380 = (double)CONCAT44(uVar34,uVar30);
        uVar32 = (int)local_3c0;
        uVar36 = (int)((ulong)local_3c0 >> 0x20);
        if ((double)local_3c0 <= (double)local_330) {
          uVar32 = (int)local_330;
          uVar36 = uVar31;
        }
        local_3c0 = (pointer)CONCAT44(uVar36,uVar32);
        uVar31 = SUB84(local_390,0);
        uVar35 = (int)((ulong)local_390 >> 0x20);
        if (local_390 <= (double)local_318) {
          uVar31 = (int)local_318;
          uVar35 = uVar33;
        }
        local_390 = (double)CONCAT44(uVar35,uVar31);
        paVar22 = paVar22 + 1;
      } while (paVar22 != paVar7);
      local_398 = (CDT *)((double)local_398 * local_320 +
                         (double)local_338 * (double)local_2d8 +
                         (double)local_370 * (double)local_340);
    }
    paVar22 = local_328;
    local_3c0 = (pointer)((double)CONCAT44(uVar36,uVar32) - local_388);
    local_380 = (double)CONCAT44(uVar34,uVar30);
    local_390 = local_390 - (double)CONCAT44(uVar34,uVar30);
    dVar38 = (double)local_3c0 * (double)local_3c0 + local_390 * local_390;
    if (dVar38 < 0.0) {
      dVar38 = sqrt(dVar38);
    }
    else {
      dVar38 = SQRT(dVar38);
    }
    if ((dVar38 == 0.0) && (!NAN(dVar38))) {
      __assert_fail("vmax.Length()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Importer/IFC/IFCOpenings.cpp"
                    ,0x5dc,
                    "bool Assimp::IFC::TryAddOpenings_Poly2Tri(const std::vector<TempOpening> &, const std::vector<IfcVector3> &, TempMesh &)"
                   );
    }
    local_1e8.super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1e8.super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1e8.super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_228.
    super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_228.
    super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_228.
    super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ClipperLib::Clipper::Clipper(&local_1a8);
    pTVar27 = (openings->
              super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pTVar23 = (openings->
              super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    if (pTVar27 != pTVar23) {
      lVar24 = 0;
      local_330 = pTVar23;
      do {
        dVar38 = paVar22->x;
        if ((0.9999989867210388 <=
             ABS(local_1c8.z * *(double *)((long)dVar38 + 0x10 + lVar24 * 0x18) +
                 local_1c8.x * *(double *)((long)dVar38 + lVar24 * 0x18) +
                 local_1c8.y * *(double *)((long)dVar38 + 8 + lVar24 * 0x18))) &&
           (peVar8 = (pTVar27->profileMesh).
                     super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
           2 < (ulong)(((long)(peVar8->mVerts).
                              super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(peVar8->mVerts).
                              super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555)
           )) {
          local_3e8.x = 0.0;
          local_3e8.y = 0.0;
          local_3e8.z = 0.0;
          paVar7 = (peVar8->mVerts).
                   super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          for (paVar22 = (peVar8->mVerts).
                         super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; dVar38 = local_3e8.y,
              paVar22 != paVar7; paVar22 = paVar22 + 1) {
            pPVar3 = (Point *)paVar22->x;
            pPVar4 = (Point *)paVar22->y;
            dVar38 = paVar22->z;
            local_3b8.
            super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)(local_2d0.a3 * dVar38 +
                          local_2d0.a1 * (double)pPVar3 + local_2d0.a2 * (double)pPVar4);
            local_3b8.
            super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 (pointer)(local_2d0.b3 * dVar38 +
                          local_2d0.b1 * (double)pPVar3 + (double)pPVar4 * local_2d0.b2);
            local_3b8.
            super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 (pointer)(local_2d0.c3 * dVar38 +
                          local_2d0.c1 * (double)pPVar3 + (double)pPVar4 * local_2d0.c2);
            dVar39 = (double)pPVar3 + (pTVar27->extrusionDir).x;
            dVar37 = (double)pPVar4 +
                     (double)(((vector<p2t::Edge_*,_std::allocator<p2t::Edge_*>_> *)
                              &(pTVar27->extrusionDir).y)->
                             super__Vector_base<p2t::Edge_*,_std::allocator<p2t::Edge_*>_>)._M_impl.
                             super__Vector_impl_data._M_start;
            dVar38 = dVar38 + (double)(pTVar27->extrusionDir).z;
            local_368.
            super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)(local_2d0.a3 * dVar38 + local_2d0.a1 * dVar39 + local_2d0.a2 * dVar37);
            local_368.
            super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 (pointer)(local_2d0.b3 * dVar38 + local_2d0.b1 * dVar39 + local_2d0.b2 * dVar37);
            local_368.
            super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 (pointer)(dVar38 * local_2d0.c3 + dVar39 * local_2d0.c1 + dVar37 * local_2d0.c2);
            pvVar18 = &local_3b8;
            if (ABS((double)local_368.
                            super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage - (double)local_398)
                < ABS((double)local_3b8.
                              super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage - (double)local_398
                     )) {
              pvVar18 = &local_368;
            }
            local_2f8.
            super__Vector_base<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 (pointer)(pvVar18->
                          super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                          )._M_impl.super__Vector_impl_data._M_start;
            local_2f8.
            super__Vector_base<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 (pointer)(pvVar18->
                          super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                          )._M_impl.super__Vector_impl_data._M_finish;
            local_3b8.
            super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)local_2f8.
                          super__Vector_base<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
            local_3b8.
            super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 (pointer)local_2f8.
                          super__Vector_base<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
            local_3b8.
            super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 (pvVar18->
                 super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>).
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
            if (local_3e8.y == local_3e8.z) {
              std::vector<aiVector2t<double>,std::allocator<aiVector2t<double>>>::
              _M_realloc_insert<aiVector2t<double>>
                        ((vector<aiVector2t<double>,std::allocator<aiVector2t<double>>> *)&local_3e8
                         ,(iterator)local_3e8.y,(aiVector2t<double> *)&local_2f8);
            }
            else {
              *(double *)local_3e8.y =
                   (double)local_2f8.
                           super__Vector_base<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
              *(pointer *)((long)local_3e8.y + 8) =
                   local_2f8.
                   super__Vector_base<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              local_3e8.y = (double)((long)local_3e8.y + 0x10);
            }
          }
          local_3b8.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
          _M_impl.super__Vector_impl_data._M_start = (IntPoint *)0x0;
          local_3b8.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
          _M_impl.super__Vector_impl_data._M_finish = (IntPoint *)0x0;
          local_3b8.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (IntPoint *)0x0;
          for (pIVar28 = (IntPoint *)local_3e8.x; pIVar28 != (IntPoint *)dVar38;
              pIVar28 = pIVar28 + 1) {
            pIVar28->X = (long64)(((double)pIVar28->X - local_388) / (double)local_3c0);
            pIVar28->Y = (long64)(((double)pIVar28->Y - local_380) / local_390);
            dVar39 = (double)pIVar28->X * 1518500249.0;
            uVar19 = (ulong)dVar39;
            local_368.
            super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)((long)(dVar39 - 9.223372036854776e+18) & (long)uVar19 >> 0x3f | uVar19);
            dVar39 = (double)pIVar28->Y * 1518500249.0;
            uVar19 = (ulong)dVar39;
            local_368.
            super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 (pointer)((long)(dVar39 - 9.223372036854776e+18) & (long)uVar19 >> 0x3f | uVar19);
            if (local_3b8.
                super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                _M_impl.super__Vector_impl_data._M_finish ==
                local_3b8.
                super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::
              _M_realloc_insert<ClipperLib::IntPoint>
                        (&local_3b8,
                         (iterator)
                         local_3b8.
                         super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                         ._M_impl.super__Vector_impl_data._M_finish,(IntPoint *)&local_368);
            }
            else {
              (local_3b8.
               super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
               _M_impl.super__Vector_impl_data._M_finish)->X =
                   (long64)local_368.
                           super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                           ._M_impl.super__Vector_impl_data._M_start;
              (local_3b8.
               super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
               _M_impl.super__Vector_impl_data._M_finish)->Y =
                   (long64)local_368.
                           super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
              local_3b8.
              super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   local_3b8.
                   super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
            }
          }
          bVar17 = ClipperLib::Orientation(&local_3b8);
          paVar22 = local_328;
          pTVar23 = local_330;
          if ((!bVar17) &&
             (pIVar21 = local_3b8.
                        super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                        ._M_impl.super__Vector_impl_data._M_finish + -1,
             pIVar28 = local_3b8.
                       super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                       ._M_impl.super__Vector_impl_data._M_start,
             local_3b8.
             super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl
             .super__Vector_impl_data._M_start < pIVar21 &&
             local_3b8.
             super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl
             .super__Vector_impl_data._M_start !=
             local_3b8.
             super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl
             .super__Vector_impl_data._M_finish)) {
            do {
              pIVar20 = pIVar28 + 1;
              local_368.
              super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)pIVar28->X;
              local_368.
              super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)pIVar28->Y;
              lVar12 = pIVar21->Y;
              pIVar28->X = pIVar21->X;
              pIVar28->Y = lVar12;
              pIVar21->X = (long64)local_368.
                                   super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                                   ._M_impl.super__Vector_impl_data._M_start;
              pIVar21->Y = (long64)local_368.
                                   super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                                   ._M_impl.super__Vector_impl_data._M_finish;
              pIVar21 = pIVar21 + -1;
              pIVar28 = pIVar20;
            } while (pIVar20 < pIVar21);
          }
          ClipperLib::ClipperBase::AddPolygon
                    ((ClipperBase *)
                     ((long)&local_1a8._vptr_Clipper +
                     (long)(((pointer)((long)local_1a8._vptr_Clipper + -0x58))->wallPoints).
                           super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start),&local_3b8,ptSubject);
          if (local_3b8.
              super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
              _M_impl.super__Vector_impl_data._M_start != (IntPoint *)0x0) {
            operator_delete(local_3b8.
                            super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          }
          if ((IntPoint *)local_3e8.x != (IntPoint *)0x0) {
            operator_delete((void *)local_3e8.x);
          }
        }
        lVar24 = lVar24 + 1;
        pTVar27 = pTVar27 + 1;
      } while (pTVar27 != pTVar23);
    }
    ClipperLib::Clipper::Execute(&local_1a8,ctUnion,&local_228,pftNonZero,pftNonZero);
    paVar15 = local_268.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (local_228.
        super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_228.
        super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      ClipperLib::Clipper::~Clipper(&local_1a8);
      bVar17 = false;
    }
    else {
      local_3e8.x = 0.0;
      local_3e8.y = 0.0;
      local_3e8.z = 0.0;
      if (local_268.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          local_268.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        paVar25 = local_268.
                  super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        do {
          paVar25->x = (paVar25->x - local_388) / (double)local_3c0;
          paVar25->y = (paVar25->y - local_380) / local_390;
          dVar38 = paVar25->x * 1518500249.0;
          uVar19 = (ulong)dVar38;
          local_3b8.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
          _M_impl.super__Vector_impl_data._M_start =
               (pointer)((long)(dVar38 - 9.223372036854776e+18) & (long)uVar19 >> 0x3f | uVar19);
          dVar38 = paVar25->y * 1518500249.0;
          uVar19 = (ulong)dVar38;
          local_3b8.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               (pointer)((long)(dVar38 - 9.223372036854776e+18) & (long)uVar19 >> 0x3f | uVar19);
          if (local_3e8.y == local_3e8.z) {
            std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::
            _M_realloc_insert<ClipperLib::IntPoint>
                      ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)
                       &local_3e8,(iterator)local_3e8.y,(IntPoint *)&local_3b8);
          }
          else {
            *(long64 *)local_3e8.y =
                 (long64)local_3b8.
                         super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                         ._M_impl.super__Vector_impl_data._M_start;
            *(pointer *)((long)local_3e8.y + 8) =
                 local_3b8.
                 super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            local_3e8.y = (double)((long)local_3e8.y + 0x10);
          }
          paVar25 = paVar25 + 1;
        } while (paVar25 != paVar15);
      }
      bVar17 = ClipperLib::Orientation((Polygon *)&local_3e8);
      if ((bVar17) &&
         (pIVar21 = (IntPoint *)((long)local_3e8.y + -0x10), pIVar28 = (IntPoint *)local_3e8.x,
         (ulong)local_3e8.x < pIVar21 && local_3e8.x != local_3e8.y)) {
        do {
          pIVar20 = pIVar28 + 1;
          local_3b8.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)pIVar28->X;
          local_3b8.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)pIVar28->Y;
          dVar38 = (double)pIVar21->Y;
          pIVar28->X = pIVar21->X;
          pIVar28->Y = (long64)dVar38;
          pIVar21->X = (long64)local_3b8.
                               super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                               ._M_impl.super__Vector_impl_data._M_start;
          pIVar21->Y = (long64)local_3b8.
                               super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
          pIVar21 = pIVar21 + -1;
          pIVar28 = pIVar20;
        } while (pIVar20 < pIVar21);
      }
      ClipperLib::Clipper::Clear(&local_1a8);
      ClipperLib::ClipperBase::AddPolygon
                ((ClipperBase *)
                 ((long)&local_1a8._vptr_Clipper +
                 (long)(((pointer)((long)local_1a8._vptr_Clipper + -0x58))->wallPoints).
                       super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                       _M_impl.super__Vector_impl_data._M_start),(Polygon *)&local_3e8,ptSubject);
      ClipperLib::ClipperBase::AddPolygons
                ((ClipperBase *)
                 ((long)&local_1a8._vptr_Clipper +
                 (long)(((pointer)((long)local_1a8._vptr_Clipper + -0x58))->wallPoints).
                       super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                       _M_impl.super__Vector_impl_data._M_start),&local_228,ptClip);
      ClipperLib::Clipper::Execute(&local_1a8,ctDifference,&local_1e8,pftNonZero,pftNonZero);
      if ((IntPoint *)local_3e8.x != (IntPoint *)0x0) {
        operator_delete((void *)local_3e8.x);
      }
      ClipperLib::Clipper::~Clipper(&local_1a8);
      local_338 = (curmesh->mVerts).
                  super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      local_328 = (curmesh->mVerts).
                  super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      local_318 = (pointer)&curmesh->mVertcnt;
      dVar38 = 0.0;
      (curmesh->mVerts).super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (curmesh->mVerts).super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (curmesh->mVerts).super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_340 = (curmesh->mVertcnt).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start;
      local_1d0 = (curmesh->mVertcnt).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      (curmesh->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (curmesh->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (curmesh->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_2f8.
      super__Vector_base<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_2f8.
      super__Vector_base<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_2f8.
      super__Vector_base<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_370 = local_1e8.
                  super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      local_2d8 = local_1e8.
                  super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      if (local_1e8.
          super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_1e8.
          super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        dVar38 = 0.0;
        uVar32 = local_208._12_4_;
        local_208._8_4_ = local_208._8_4_;
        local_208._0_8_ = local_208._0_8_ * (double)local_398;
        local_208._12_4_ = uVar32;
        local_300 = local_300 * (double)local_398;
        local_308 = local_308 * (double)local_398;
        do {
          pvVar14 = local_2f8.
                    super__Vector_base<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          pvVar13 = local_2f8.
                    super__Vector_base<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pIVar26 = (pointer)local_2f8.
                             super__Vector_base<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
          local_320 = dVar38;
          if (local_2f8.
              super__Vector_base<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              local_2f8.
              super__Vector_base<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            do {
              if ((void *)pIVar26->X != (void *)0x0) {
                operator_delete((void *)pIVar26->X);
              }
              pIVar9 = pIVar26 + 1;
              pIVar26 = (pointer)&pIVar9->Y;
            } while ((pointer)&pIVar9->Y != pvVar14);
            local_2f8.
            super__Vector_base<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = pvVar13;
          }
          local_288.super__Vector_base<p2t::Point_*,_std::allocator<p2t::Point_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_288.super__Vector_base<p2t::Point_*,_std::allocator<p2t::Point_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (Point **)0x0;
          local_288.super__Vector_base<p2t::Point_*,_std::allocator<p2t::Point_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (Point **)0x0;
          pIVar9 = (local_370->outer).
                   super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          for (pIVar26 = (local_370->outer).
                         super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                         ._M_impl.super__Vector_impl_data._M_start; pIVar26 != pIVar9;
              pIVar26 = pIVar26 + 1) {
            local_1a8._vptr_Clipper = (_func_int **)operator_new(0x28);
            lVar24 = pIVar26->Y;
            ((pointer)local_1a8._vptr_Clipper)->solid =
                 (IfcSolidModel *)((double)pIVar26->X / 1518500249.0);
            (((pointer)local_1a8._vptr_Clipper)->extrusionDir).x = (double)lVar24 / 1518500249.0;
            (((vector<p2t::Edge_*,_std::allocator<p2t::Edge_*>_> *)
             &(((pointer)local_1a8._vptr_Clipper)->extrusionDir).y)->
            super__Vector_base<p2t::Edge_*,_std::allocator<p2t::Edge_*>_>)._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            (((pointer)local_1a8._vptr_Clipper)->extrusionDir).z = 0.0;
            (((pointer)local_1a8._vptr_Clipper)->profileMesh).
            super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            if (local_288.super__Vector_base<p2t::Point_*,_std::allocator<p2t::Point_*>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_288.super__Vector_base<p2t::Point_*,_std::allocator<p2t::Point_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<p2t::Point*,std::allocator<p2t::Point*>>::_M_realloc_insert<p2t::Point*>
                        ((vector<p2t::Point*,std::allocator<p2t::Point*>> *)&local_288,
                         (iterator)
                         local_288.super__Vector_base<p2t::Point_*,_std::allocator<p2t::Point_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish,(Point **)&local_1a8);
            }
            else {
              *local_288.super__Vector_base<p2t::Point_*,_std::allocator<p2t::Point_*>_>._M_impl.
               super__Vector_impl_data._M_finish = (Point *)local_1a8._vptr_Clipper;
              local_288.super__Vector_base<p2t::Point_*,_std::allocator<p2t::Point_*>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_288.super__Vector_base<p2t::Point_*,_std::allocator<p2t::Point_*>_>._M_impl
                   .super__Vector_impl_data._M_finish + 1;
            }
          }
          local_398 = (CDT *)operator_new(0x10);
          p2t::CDT::CDT(local_398,&local_288);
          pTVar27 = (pointer)(local_370->holes).
                             super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
          local_330 = (pointer)(local_370->holes).
                               super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
          if (pTVar27 != local_330) {
            do {
              local_1a8._vptr_Clipper = (_func_int **)0x0;
              local_1a8.m_PolyOuts.
              super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_1a8.m_PolyOuts.
              super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              std::
              vector<std::vector<p2t::Point*,std::allocator<p2t::Point*>>,std::allocator<std::vector<p2t::Point*,std::allocator<p2t::Point*>>>>
              ::emplace_back<std::vector<p2t::Point*,std::allocator<p2t::Point*>>>
                        ((vector<std::vector<p2t::Point*,std::allocator<p2t::Point*>>,std::allocator<std::vector<p2t::Point*,std::allocator<p2t::Point*>>>>
                          *)&local_2f8,
                         (vector<p2t::Point_*,_std::allocator<p2t::Point_*>_> *)&local_1a8);
              if ((pointer)local_1a8._vptr_Clipper != (pointer)0x0) {
                operator_delete(local_1a8._vptr_Clipper);
              }
              pvVar13 = local_2f8.
                        super__Vector_base<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              pIVar26 = (pointer)((long)local_2f8.
                                        super__Vector_base<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish + -0x20);
              pIVar10 = (IfcSolidModel *)(pTVar27->extrusionDir).x;
              for (pIVar29 = pTVar27->solid; pIVar29 != pIVar10;
                  pIVar29 = (IfcSolidModel *)
                            &(pIVar29->super_IfcGeometricRepresentationItem).
                             super_IfcRepresentationItem.
                             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                             .field_0x10) {
                local_1a8._vptr_Clipper = (_func_int **)operator_new(0x28);
                lVar24 = *(long *)&(pIVar29->super_IfcGeometricRepresentationItem).
                                   super_IfcRepresentationItem.
                                   super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                                   .field_0x8;
                ((pointer)local_1a8._vptr_Clipper)->solid =
                     (IfcSolidModel *)
                     ((double)(long)(pIVar29->super_IfcGeometricRepresentationItem).
                                    super_IfcRepresentationItem.
                                    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                                    ._vptr_ObjectHelper / 1518500249.0);
                (((pointer)local_1a8._vptr_Clipper)->extrusionDir).x = (double)lVar24 / 1518500249.0
                ;
                (((vector<p2t::Edge_*,_std::allocator<p2t::Edge_*>_> *)
                 &(((pointer)local_1a8._vptr_Clipper)->extrusionDir).y)->
                super__Vector_base<p2t::Edge_*,_std::allocator<p2t::Edge_*>_>)._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                (((pointer)local_1a8._vptr_Clipper)->extrusionDir).z = 0.0;
                (((pointer)local_1a8._vptr_Clipper)->profileMesh).
                super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)0x0;
                __position._M_current = (Point **)((pointer)((long)pvVar13 + -0x10))->X;
                if (__position._M_current == (Point **)((pointer)((long)pvVar13 + -0x10))->Y) {
                  std::vector<p2t::Point*,std::allocator<p2t::Point*>>::
                  _M_realloc_insert<p2t::Point*>
                            ((vector<p2t::Point*,std::allocator<p2t::Point*>> *)&pIVar26->Y,
                             __position,(Point **)&local_1a8);
                }
                else {
                  *__position._M_current = (Point *)local_1a8._vptr_Clipper;
                  ((pointer)((long)pvVar13 + -0x10))->X = ((pointer)((long)pvVar13 + -0x10))->X + 8;
                }
              }
              p2t::CDT::AddHole(local_398,
                                (vector<p2t::Point_*,_std::allocator<p2t::Point_*>_> *)&pIVar26->Y);
              pTVar27 = (pointer)&(pTVar27->extrusionDir).z;
            } while (pTVar27 != local_330);
          }
          this = local_398;
          p2t::CDT::Triangulate(local_398);
          p2t::CDT::GetTriangles
                    ((vector<p2t::Triangle_*,_std::allocator<p2t::Triangle_*>_> *)&local_1a8,this);
          ppOVar16 = local_1a8.m_PolyOuts.
                     super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          for (pTVar27 = (pointer)local_1a8._vptr_Clipper; pTVar27 != (pointer)ppOVar16;
              pTVar27 = (pointer)&pTVar27->extrusionDir) {
            pIVar29 = pTVar27->solid;
            lVar24 = 1;
            do {
              pp_Var11 = (&(pIVar29->super_IfcGeometricRepresentationItem).
                           super_IfcRepresentationItem.
                           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                           _vptr_ObjectHelper)[lVar24];
              p_Var5 = *pp_Var11;
              if ((((1.0 < (double)p_Var5) || ((double)p_Var5 < 0.0)) ||
                  (p_Var6 = pp_Var11[1], 1.0 < (double)p_Var6)) || ((double)p_Var6 < 0.0)) {
                __assert_fail("v.x <= 1.0 && v.x >= 0.0 && v.y <= 1.0 && v.y >= 0.0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Importer/IFC/IFCOpenings.cpp"
                              ,0x68a,
                              "bool Assimp::IFC::TryAddOpenings_Poly2Tri(const std::vector<TempOpening> &, const std::vector<IfcVector3> &, TempMesh &)"
                             );
              }
              dVar38 = (double)p_Var5 * (double)local_3c0 + local_388;
              dVar39 = (double)p_Var6 * local_390 + local_380;
              local_3e8.x = local_310 * dVar38 + (double)local_1f8._0_8_ * dVar39 +
                            (double)local_208._0_8_;
              local_3e8.y = local_248 * dVar38 + local_240 * dVar39 + local_300;
              local_3e8.z = dVar38 * local_238 + dVar39 * local_230 + local_308;
              __position_00._M_current =
                   (curmesh->mVerts).
                   super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
              if (__position_00._M_current ==
                  (curmesh->mVerts).
                  super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
                _M_realloc_insert<aiVector3t<double>const&>
                          ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)curmesh,
                           __position_00,&local_3e8);
              }
              else {
                (__position_00._M_current)->z = local_3e8.z;
                (__position_00._M_current)->x = local_3e8.x;
                (__position_00._M_current)->y = local_3e8.y;
                ppaVar1 = &(curmesh->mVerts).
                           super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                *ppaVar1 = *ppaVar1 + 1;
              }
              lVar24 = lVar24 + 1;
            } while (lVar24 != 4);
            local_3e8.x = (double)CONCAT44(local_3e8.x._4_4_,3);
            __position_01._M_current =
                 (curmesh->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            if (__position_01._M_current ==
                (curmesh->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_318,
                         __position_01,(uint *)&local_3e8);
            }
            else {
              *__position_01._M_current = 3;
              ppuVar2 = &(curmesh->mVertcnt).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
              *ppuVar2 = *ppuVar2 + 1;
            }
          }
          if ((pointer)local_1a8._vptr_Clipper != (pointer)0x0) {
            operator_delete(local_1a8._vptr_Clipper);
          }
          dVar38 = (double)CONCAT71((int7)((ulong)this >> 8),1);
          if (local_288.super__Vector_base<p2t::Point_*,_std::allocator<p2t::Point_*>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_288.
                            super__Vector_base<p2t::Point_*,_std::allocator<p2t::Point_*>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          local_370 = local_370 + 1;
        } while (local_370 != local_2d8);
      }
      bVar17 = SUB81(dVar38,0);
      if (((ulong)dVar38 & 1) == 0) {
        std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<aiVector3t<double>*,std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>>>
                  ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)curmesh,
                   (curmesh->mVerts).
                   super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish,local_338,local_328);
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_318,
                   (curmesh->mVertcnt).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish,local_340,local_1d0);
        LogFunctions<Assimp::IFCImporter>::LogError((char *)0x5e106e);
      }
      std::
      vector<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
      ::~vector(&local_2f8);
      if (local_340 != (pointer)0x0) {
        operator_delete(local_340);
      }
      if (local_338 != (pointer)0x0) {
        operator_delete(local_338);
      }
    }
    std::
    vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
    ::~vector(&local_228);
    std::vector<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>::~vector(&local_1e8);
    if (local_268.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (aiVector2t<double> *)0x0) {
      operator_delete(local_268.
                      super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
    bVar17 = false;
  }
  return bVar17;
}

Assistant:

bool TryAddOpenings_Poly2Tri(const std::vector<TempOpening>& openings,const std::vector<IfcVector3>& nors,
    TempMesh& curmesh)
{
    IFCImporter::LogWarn("forced to use poly2tri fallback method to generate wall openings");
    std::vector<IfcVector3>& out = curmesh.mVerts;

    bool result = false;

    // Try to derive a solid base plane within the current surface for use as
    // working coordinate system.
    bool ok;
    IfcVector3 nor;
    const IfcMatrix3 m = DerivePlaneCoordinateSpace(curmesh, ok, nor);
    if (!ok) {
        return false;
    }

    const IfcMatrix3 minv = IfcMatrix3(m).Inverse();


    IfcFloat coord = -1;

    std::vector<IfcVector2> contour_flat;
    contour_flat.reserve(out.size());

    IfcVector2 vmin, vmax;
    MinMaxChooser<IfcVector2>()(vmin, vmax);

    // Move all points into the new coordinate system, collecting min/max verts on the way
    for(IfcVector3& x : out) {
        const IfcVector3 vv = m * x;

        // keep Z offset in the plane coordinate system. Ignoring precision issues
        // (which  are present, of course), this should be the same value for
        // all polygon vertices (assuming the polygon is planar).


        // XXX this should be guarded, but we somehow need to pick a suitable
        // epsilon
        // if(coord != -1.0f) {
        //  assert(std::fabs(coord - vv.z) < 1e-3f);
        // }

        coord = vv.z;

        vmin = std::min(IfcVector2(vv.x, vv.y), vmin);
        vmax = std::max(IfcVector2(vv.x, vv.y), vmax);

        contour_flat.push_back(IfcVector2(vv.x,vv.y));
    }

    // With the current code in DerivePlaneCoordinateSpace,
    // vmin,vmax should always be the 0...1 rectangle (+- numeric inaccuracies)
    // but here we won't rely on this.

    vmax -= vmin;

    // If this happens then the projection must have been wrong.
    ai_assert(vmax.Length());

    ClipperLib::ExPolygons clipped;
    ClipperLib::Polygons holes_union;


    IfcVector3 wall_extrusion;
    bool first = true;

    try {

        ClipperLib::Clipper clipper_holes;
        size_t c = 0;

        for(const TempOpening& t :openings) {
            const IfcVector3& outernor = nors[c++];
            const IfcFloat dot = nor * outernor;
            if (std::fabs(dot)<1.f-1e-6f) {
                continue;
            }

            const std::vector<IfcVector3>& va = t.profileMesh->mVerts;
            if(va.size() <= 2) {
                continue;
            }

            std::vector<IfcVector2> contour;

            for(const IfcVector3& xx : t.profileMesh->mVerts) {
                IfcVector3 vv = m *  xx, vv_extr = m * (xx + t.extrusionDir);

                const bool is_extruded_side = std::fabs(vv.z - coord) > std::fabs(vv_extr.z - coord);
                if (first) {
                    first = false;
                    if (dot > 0.f) {
                        wall_extrusion = t.extrusionDir;
                        if (is_extruded_side) {
                            wall_extrusion = - wall_extrusion;
                        }
                    }
                }

                // XXX should not be necessary - but it is. Why? For precision reasons?
                vv = is_extruded_side ? vv_extr : vv;
                contour.push_back(IfcVector2(vv.x,vv.y));
            }

            ClipperLib::Polygon hole;
            for(IfcVector2& pip : contour) {
                pip.x  = (pip.x - vmin.x) / vmax.x;
                pip.y  = (pip.y - vmin.y) / vmax.y;

                hole.push_back(ClipperLib::IntPoint(  to_int64(pip.x), to_int64(pip.y) ));
            }

            if (!ClipperLib::Orientation(hole)) {
                std::reverse(hole.begin(), hole.end());
            //  assert(ClipperLib::Orientation(hole));
            }

            /*ClipperLib::Polygons pol_temp(1), pol_temp2(1);
            pol_temp[0] = hole;

            ClipperLib::OffsetPolygons(pol_temp,pol_temp2,5.0);
            hole = pol_temp2[0];*/

            clipper_holes.AddPolygon(hole,ClipperLib::ptSubject);
        }

        clipper_holes.Execute(ClipperLib::ctUnion,holes_union,
            ClipperLib::pftNonZero,
            ClipperLib::pftNonZero);

        if (holes_union.empty()) {
            return false;
        }

        // Now that we have the big union of all holes, subtract it from the outer contour
        // to obtain the final polygon to feed into the triangulator.
        {
            ClipperLib::Polygon poly;
            for(IfcVector2& pip : contour_flat) {
                pip.x  = (pip.x - vmin.x) / vmax.x;
                pip.y  = (pip.y - vmin.y) / vmax.y;

                poly.push_back(ClipperLib::IntPoint( to_int64(pip.x), to_int64(pip.y) ));
            }

            if (ClipperLib::Orientation(poly)) {
                std::reverse(poly.begin(), poly.end());
            }
            clipper_holes.Clear();
            clipper_holes.AddPolygon(poly,ClipperLib::ptSubject);

            clipper_holes.AddPolygons(holes_union,ClipperLib::ptClip);
            clipper_holes.Execute(ClipperLib::ctDifference,clipped,
                ClipperLib::pftNonZero,
                ClipperLib::pftNonZero);
        }

    }
    catch (const char* sx) {
        IFCImporter::LogError("Ifc: error during polygon clipping, skipping openings for this face: (Clipper: "
            + std::string(sx) + ")");

        return false;
    }

    std::vector<IfcVector3> old_verts;
    std::vector<unsigned int> old_vertcnt;

    old_verts.swap(curmesh.mVerts);
    old_vertcnt.swap(curmesh.mVertcnt);

    std::vector< std::vector<p2t::Point*> > contours;
    for(ClipperLib::ExPolygon& clip : clipped) {

        contours.clear();

        // Build the outer polygon contour line for feeding into poly2tri
        std::vector<p2t::Point*> contour_points;
        for(ClipperLib::IntPoint& point : clip.outer) {
            contour_points.push_back( new p2t::Point(from_int64(point.X), from_int64(point.Y)) );
        }

        p2t::CDT* cdt ;
        try {
            // Note: this relies on custom modifications in poly2tri to raise runtime_error's
            // instead if assertions. These failures are not debug only, they can actually
            // happen in production use if the input data is broken. An assertion would be
            // inappropriate.
            cdt = new p2t::CDT(contour_points);
        }
        catch(const std::exception& e) {
            IFCImporter::LogError("Ifc: error during polygon triangulation, skipping some openings: (poly2tri: "
                + std::string(e.what()) + ")");
            continue;
        }


        // Build the poly2tri inner contours for all holes we got from ClipperLib
        for(ClipperLib::Polygon& opening : clip.holes) {

            contours.push_back(std::vector<p2t::Point*>());
            std::vector<p2t::Point*>& contour = contours.back();

            for(ClipperLib::IntPoint& point : opening) {
                contour.push_back( new p2t::Point(from_int64(point.X), from_int64(point.Y)) );
            }

            cdt->AddHole(contour);
        }

        try {
            // Note: See above
            cdt->Triangulate();
        }
        catch(const std::exception& e) {
            IFCImporter::LogError("Ifc: error during polygon triangulation, skipping some openings: (poly2tri: "
                + std::string(e.what()) + ")");
            continue;
        }

        const std::vector<p2t::Triangle*> tris = cdt->GetTriangles();

        // Collect the triangles we just produced
        for(p2t::Triangle* tri : tris) {
            for(int i = 0; i < 3; ++i) {

                const IfcVector2 v = IfcVector2(
                    static_cast<IfcFloat>( tri->GetPoint(i)->x ),
                    static_cast<IfcFloat>( tri->GetPoint(i)->y )
                );

                ai_assert(v.x <= 1.0 && v.x >= 0.0 && v.y <= 1.0 && v.y >= 0.0);
                const IfcVector3 v3 = minv * IfcVector3(vmin.x + v.x * vmax.x, vmin.y + v.y * vmax.y,coord) ;

                curmesh.mVerts.push_back(v3);
            }
            curmesh.mVertcnt.push_back(3);
        }

        result = true;
    }

    if (!result) {
        // revert -- it's a shame, but better than nothing
        curmesh.mVerts.insert(curmesh.mVerts.end(),old_verts.begin(), old_verts.end());
        curmesh.mVertcnt.insert(curmesh.mVertcnt.end(),old_vertcnt.begin(), old_vertcnt.end());

        IFCImporter::LogError("Ifc: revert, could not generate openings for this wall");
    }

    return result;
}